

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<const_double> * __thiscall
kj::heapArray<double_const,double_const*>
          (Array<const_double> *__return_storage_ptr__,kj *this,double *begin,double *end)

{
  double *pdVar1;
  long lVar2;
  Array<const_double> *result;
  ArrayBuilder<const_double> local_38;
  
  pdVar1 = _::HeapArrayDisposer::allocateUninitialized<double>((long)begin - (long)this >> 3);
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  for (lVar2 = 0; this + lVar2 != (kj *)begin; lVar2 = lVar2 + 8) {
    *(double *)((long)pdVar1 + lVar2) = *(double *)(this + lVar2);
  }
  __return_storage_ptr__->ptr = pdVar1;
  __return_storage_ptr__->size_ = lVar2 >> 3;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_38.ptr = (double *)0x0;
  local_38.pos = (RemoveConst<const_double> *)0x0;
  local_38.endPtr = (double *)0x0;
  ArrayBuilder<const_double>::dispose(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}